

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ess_describe_scaling_instances.cc
# Opt level: O3

int __thiscall
aliyun::Ess::DescribeScalingInstances
          (Ess *this,EssDescribeScalingInstancesRequestType *req,
          EssDescribeScalingInstancesResponseType *response,EssErrorInfo *error_info)

{
  iterator *piVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  Int IVar5;
  ArrayIndex AVar6;
  char *pcVar7;
  AliRpcRequest *this_00;
  long *plVar8;
  size_t sVar9;
  Value *pVVar10;
  Value *pVVar11;
  Value *pVVar12;
  size_type *psVar13;
  uint index;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  string local_b80;
  Value local_b60;
  EssDescribeScalingInstancesResponseType *local_b48;
  long *local_b40;
  long local_b38;
  long local_b30 [2];
  string local_b20;
  undefined1 local_b00 [32];
  _Alloc_hider local_ae0;
  size_type local_ad8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ad0;
  _Alloc_hider local_ac0;
  size_type local_ab8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ab0;
  _Alloc_hider local_aa0;
  size_type local_a98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a90;
  _Alloc_hider local_a80;
  size_type local_a78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a70;
  _Alloc_hider local_a60;
  size_type local_a58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a50;
  _Alloc_hider local_a40;
  size_type local_a38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a30;
  string local_a20;
  string local_a00;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_b20._M_dataplus._M_p = (pointer)&local_b20.field_2;
  local_b20._M_string_length = 0;
  local_b20.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar7 = "https";
  }
  local_b40 = local_b30;
  local_b48 = response;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b40,pcVar7,pcVar7 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)local_b00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_b80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_b60);
  piVar1 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_b40,local_b38 + (long)local_b40);
  std::__cxx11::string::append((char *)&local_140);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar13 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_a20.field_2._M_allocated_capacity = *psVar13;
    local_a20.field_2._8_8_ = plVar8[3];
    local_a20._M_dataplus._M_p = (pointer)&local_a20.field_2;
  }
  else {
    local_a20.field_2._M_allocated_capacity = *psVar13;
    local_a20._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_a20._M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_a20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a20._M_dataplus._M_p != &local_a20.field_2) {
    operator_delete(local_a20._M_dataplus._M_p,local_a20.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar1) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar9 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar7,pcVar7 + sVar9);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_b60,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,"DescribeScalingInstances","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->owner_id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"OwnerId","");
    pcVar2 = (req->owner_id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar2,pcVar2 + (req->owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"ResourceOwnerAccount","");
    pcVar2 = (req->resource_owner_account)._M_dataplus._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar2,pcVar2 + (req->resource_owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"ResourceOwnerId","");
    pcVar2 = (req->resource_owner_id)._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar2,pcVar2 + (req->resource_owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_group_id)._M_string_length != 0) {
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"ScalingGroupId","");
    pcVar2 = (req->scaling_group_id)._M_dataplus._M_p;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,pcVar2,pcVar2 + (req->scaling_group_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->scaling_configuration_id)._M_string_length != 0) {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_340,"ScalingConfigurationId","");
    pcVar2 = (req->scaling_configuration_id)._M_dataplus._M_p;
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,pcVar2,pcVar2 + (req->scaling_configuration_id)._M_string_length
              );
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->health_status)._M_string_length != 0) {
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"HealthStatus","");
    pcVar2 = (req->health_status)._M_dataplus._M_p;
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,pcVar2,pcVar2 + (req->health_status)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->lifecycle_state)._M_string_length != 0) {
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"LifecycleState","");
    pcVar2 = (req->lifecycle_state)._M_dataplus._M_p;
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3e0,pcVar2,pcVar2 + (req->lifecycle_state)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->creation_type)._M_string_length != 0) {
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"CreationType","");
    pcVar2 = (req->creation_type)._M_dataplus._M_p;
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_420,pcVar2,pcVar2 + (req->creation_type)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_400,&local_420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->page_number)._M_string_length != 0) {
    local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"PageNumber","");
    pcVar2 = (req->page_number)._M_dataplus._M_p;
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_460,pcVar2,pcVar2 + (req->page_number)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_440,&local_460);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->page_size)._M_string_length != 0) {
    local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"PageSize","");
    pcVar2 = (req->page_size)._M_dataplus._M_p;
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4a0,pcVar2,pcVar2 + (req->page_size)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_480,&local_4a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_480._M_dataplus._M_p != &local_480.field_2) {
      operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id1)._M_string_length != 0) {
    local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"InstanceId.1","");
    pcVar2 = (req->instance_id1)._M_dataplus._M_p;
    local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4e0,pcVar2,pcVar2 + (req->instance_id1)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4c0,&local_4e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
      operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
      operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id2)._M_string_length != 0) {
    local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"InstanceId.2","");
    pcVar2 = (req->instance_id2)._M_dataplus._M_p;
    local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_520,pcVar2,pcVar2 + (req->instance_id2)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_500,&local_520);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != &local_520.field_2) {
      operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id3)._M_string_length != 0) {
    local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"InstanceId.3","");
    pcVar2 = (req->instance_id3)._M_dataplus._M_p;
    local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_560,pcVar2,pcVar2 + (req->instance_id3)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_540,&local_560);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_560._M_dataplus._M_p != &local_560.field_2) {
      operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != &local_540.field_2) {
      operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id4)._M_string_length != 0) {
    local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"InstanceId.4","");
    pcVar2 = (req->instance_id4)._M_dataplus._M_p;
    local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5a0,pcVar2,pcVar2 + (req->instance_id4)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_580,&local_5a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
      operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._M_dataplus._M_p != &local_580.field_2) {
      operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id5)._M_string_length != 0) {
    local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"InstanceId.5","");
    pcVar2 = (req->instance_id5)._M_dataplus._M_p;
    local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5e0,pcVar2,pcVar2 + (req->instance_id5)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_5c0,&local_5e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
      operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
      operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id6)._M_string_length != 0) {
    local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"InstanceId.6","");
    pcVar2 = (req->instance_id6)._M_dataplus._M_p;
    local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_620,pcVar2,pcVar2 + (req->instance_id6)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_600,&local_620);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_620._M_dataplus._M_p != &local_620.field_2) {
      operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_600._M_dataplus._M_p != &local_600.field_2) {
      operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id7)._M_string_length != 0) {
    local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"InstanceId.7","");
    pcVar2 = (req->instance_id7)._M_dataplus._M_p;
    local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_660,pcVar2,pcVar2 + (req->instance_id7)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_640,&local_660);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_660._M_dataplus._M_p != &local_660.field_2) {
      operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_640._M_dataplus._M_p != &local_640.field_2) {
      operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id8)._M_string_length != 0) {
    local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_680,"InstanceId.8","");
    pcVar2 = (req->instance_id8)._M_dataplus._M_p;
    local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6a0,pcVar2,pcVar2 + (req->instance_id8)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_680,&local_6a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
      operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_680._M_dataplus._M_p != &local_680.field_2) {
      operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id9)._M_string_length != 0) {
    local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"InstanceId.9","");
    pcVar2 = (req->instance_id9)._M_dataplus._M_p;
    local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6e0,pcVar2,pcVar2 + (req->instance_id9)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_6c0,&local_6e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
      operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
      operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id10)._M_string_length != 0) {
    local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_700,"InstanceId.10","");
    pcVar2 = (req->instance_id10)._M_dataplus._M_p;
    local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_720,pcVar2,pcVar2 + (req->instance_id10)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_700,&local_720);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_720._M_dataplus._M_p != &local_720.field_2) {
      operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_700._M_dataplus._M_p != &local_700.field_2) {
      operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id11)._M_string_length != 0) {
    local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_740,"InstanceId.11","");
    pcVar2 = (req->instance_id11)._M_dataplus._M_p;
    local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_760,pcVar2,pcVar2 + (req->instance_id11)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_740,&local_760);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_760._M_dataplus._M_p != &local_760.field_2) {
      operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_740._M_dataplus._M_p != &local_740.field_2) {
      operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id12)._M_string_length != 0) {
    local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_780,"InstanceId.12","");
    pcVar2 = (req->instance_id12)._M_dataplus._M_p;
    local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7a0,pcVar2,pcVar2 + (req->instance_id12)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_780,&local_7a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
      operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_780._M_dataplus._M_p != &local_780.field_2) {
      operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id13)._M_string_length != 0) {
    local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"InstanceId.13","");
    pcVar2 = (req->instance_id13)._M_dataplus._M_p;
    local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7e0,pcVar2,pcVar2 + (req->instance_id13)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_7c0,&local_7e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
      operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
      operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id14)._M_string_length != 0) {
    local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_800,"InstanceId.14","");
    pcVar2 = (req->instance_id14)._M_dataplus._M_p;
    local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_820,pcVar2,pcVar2 + (req->instance_id14)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_800,&local_820);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_820._M_dataplus._M_p != &local_820.field_2) {
      operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_800._M_dataplus._M_p != &local_800.field_2) {
      operator_delete(local_800._M_dataplus._M_p,local_800.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id15)._M_string_length != 0) {
    local_840._M_dataplus._M_p = (pointer)&local_840.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_840,"InstanceId.15","");
    pcVar2 = (req->instance_id15)._M_dataplus._M_p;
    local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_860,pcVar2,pcVar2 + (req->instance_id15)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_840,&local_860);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_860._M_dataplus._M_p != &local_860.field_2) {
      operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_840._M_dataplus._M_p != &local_840.field_2) {
      operator_delete(local_840._M_dataplus._M_p,local_840.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id16)._M_string_length != 0) {
    local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_880,"InstanceId.16","");
    pcVar2 = (req->instance_id16)._M_dataplus._M_p;
    local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_8a0,pcVar2,pcVar2 + (req->instance_id16)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_880,&local_8a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
      operator_delete(local_8a0._M_dataplus._M_p,local_8a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_880._M_dataplus._M_p != &local_880.field_2) {
      operator_delete(local_880._M_dataplus._M_p,local_880.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id17)._M_string_length != 0) {
    local_8c0._M_dataplus._M_p = (pointer)&local_8c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c0,"InstanceId.17","");
    pcVar2 = (req->instance_id17)._M_dataplus._M_p;
    local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_8e0,pcVar2,pcVar2 + (req->instance_id17)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_8c0,&local_8e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
      operator_delete(local_8e0._M_dataplus._M_p,local_8e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8c0._M_dataplus._M_p != &local_8c0.field_2) {
      operator_delete(local_8c0._M_dataplus._M_p,local_8c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id18)._M_string_length != 0) {
    local_900._M_dataplus._M_p = (pointer)&local_900.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_900,"InstanceId.18","");
    pcVar2 = (req->instance_id18)._M_dataplus._M_p;
    local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_920,pcVar2,pcVar2 + (req->instance_id18)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_900,&local_920);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_920._M_dataplus._M_p != &local_920.field_2) {
      operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_900._M_dataplus._M_p != &local_900.field_2) {
      operator_delete(local_900._M_dataplus._M_p,local_900.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id19)._M_string_length != 0) {
    local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_940,"InstanceId.19","");
    pcVar2 = (req->instance_id19)._M_dataplus._M_p;
    local_960._M_dataplus._M_p = (pointer)&local_960.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_960,pcVar2,pcVar2 + (req->instance_id19)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_940,&local_960);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_960._M_dataplus._M_p != &local_960.field_2) {
      operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_940._M_dataplus._M_p != &local_940.field_2) {
      operator_delete(local_940._M_dataplus._M_p,local_940.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_id20)._M_string_length != 0) {
    local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_980,"InstanceId.20","");
    pcVar2 = (req->instance_id20)._M_dataplus._M_p;
    local_9a0._M_dataplus._M_p = (pointer)&local_9a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_9a0,pcVar2,pcVar2 + (req->instance_id20)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_980,&local_9a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9a0._M_dataplus._M_p != &local_9a0.field_2) {
      operator_delete(local_9a0._M_dataplus._M_p,local_9a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_980._M_dataplus._M_p != &local_980.field_2) {
      operator_delete(local_980._M_dataplus._M_p,local_980.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->owner_account)._M_string_length != 0) {
    local_9c0._M_dataplus._M_p = (pointer)&local_9c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c0,"OwnerAccount","");
    pcVar2 = (req->owner_account)._M_dataplus._M_p;
    local_9e0._M_dataplus._M_p = (pointer)&local_9e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_9e0,pcVar2,pcVar2 + (req->owner_account)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_9c0,&local_9e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
      operator_delete(local_9e0._M_dataplus._M_p,local_9e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9c0._M_dataplus._M_p != &local_9c0.field_2) {
      operator_delete(local_9c0._M_dataplus._M_p,local_9c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_a00._M_dataplus._M_p = (pointer)&local_a00.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a00,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_b00);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_a00,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a00._M_dataplus._M_p != &local_a00.field_2) {
      operator_delete(local_a00._M_dataplus._M_p,local_a00.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_b20);
    if (((0 < iVar4) && (local_b20._M_string_length != 0)) &&
       (bVar3 = Json::Reader::parse(&local_140,&local_b20,&local_b60,true), bVar3)) {
      if (error_info != (EssErrorInfo *)0x0 && iVar4 != 200) {
        bVar3 = Json::Value::isMember(&local_b60,"RequestId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_b60,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_b00,pVVar10);
        }
        else {
          local_b00._0_8_ = local_b00 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b00,anon_var_dwarf_211f3a + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_b00);
        pcVar2 = local_b00 + 0x10;
        if ((pointer)local_b00._0_8_ != pcVar2) {
          operator_delete((void *)local_b00._0_8_,CONCAT71(local_b00._17_7_,local_b00[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_b60,"Code");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_b60,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_b00,pVVar10);
        }
        else {
          local_b00._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b00,anon_var_dwarf_211f3a + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_b00);
        if ((pointer)local_b00._0_8_ != pcVar2) {
          operator_delete((void *)local_b00._0_8_,CONCAT71(local_b00._17_7_,local_b00[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_b60,"HostId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_b60,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_b00,pVVar10);
        }
        else {
          local_b00._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b00,anon_var_dwarf_211f3a + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_b00);
        if ((pointer)local_b00._0_8_ != pcVar2) {
          operator_delete((void *)local_b00._0_8_,CONCAT71(local_b00._17_7_,local_b00[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_b60,"Message");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_b60,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_b00,pVVar10);
        }
        else {
          local_b00._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b00,anon_var_dwarf_211f3a + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_b00);
        if ((pointer)local_b00._0_8_ != pcVar2) {
          operator_delete((void *)local_b00._0_8_,CONCAT71(local_b00._17_7_,local_b00[0x10]) + 1);
        }
      }
      if (local_b48 != (EssDescribeScalingInstancesResponseType *)0x0 && iVar4 == 200) {
        bVar3 = Json::Value::isMember(&local_b60,"TotalCount");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_b60,"TotalCount");
          IVar5 = Json::Value::asInt(pVVar10);
          local_b48->total_count = IVar5;
        }
        bVar3 = Json::Value::isMember(&local_b60,"PageNumber");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_b60,"PageNumber");
          IVar5 = Json::Value::asInt(pVVar10);
          local_b48->page_number = IVar5;
        }
        bVar3 = Json::Value::isMember(&local_b60,"PageSize");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_b60,"PageSize");
          IVar5 = Json::Value::asInt(pVVar10);
          local_b48->page_size = IVar5;
        }
        bVar3 = Json::Value::isMember(&local_b60,"ScalingInstances");
        iVar4 = 200;
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_b60,"ScalingInstances");
          bVar3 = Json::Value::isMember(pVVar10,"ScalingInstance");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&local_b60,"ScalingInstances");
            pVVar10 = Json::Value::operator[](pVVar10,"ScalingInstance");
            bVar3 = Json::Value::isArray(pVVar10);
            if ((bVar3) && (AVar6 = Json::Value::size(pVVar10), AVar6 != 0)) {
              index = 0;
              do {
                local_b00._0_8_ = local_b00 + 0x10;
                local_b00._8_8_ = 0;
                local_b00[0x10] = '\0';
                local_ae0._M_p = (pointer)&local_ad0;
                local_ad8 = 0;
                local_ad0._M_local_buf[0] = '\0';
                local_ac0._M_p = (pointer)&local_ab0;
                local_ab8 = 0;
                local_ab0._M_local_buf[0] = '\0';
                local_aa0._M_p = (pointer)&local_a90;
                local_a98 = 0;
                local_a90._M_local_buf[0] = '\0';
                local_a80._M_p = (pointer)&local_a70;
                local_a78 = 0;
                local_a70._M_local_buf[0] = '\0';
                local_a60._M_p = (pointer)&local_a50;
                local_a58 = 0;
                local_a50._M_local_buf[0] = '\0';
                local_a40._M_p = (pointer)&local_a30;
                local_a38 = 0;
                local_a30._M_local_buf[0] = '\0';
                pVVar11 = Json::Value::operator[](pVVar10,index);
                bVar3 = Json::Value::isMember(pVVar11,"InstanceId");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"InstanceId");
                  Json::Value::asString_abi_cxx11_(&local_b80,pVVar12);
                  std::__cxx11::string::operator=((string *)local_b00,(string *)&local_b80);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
                    operator_delete(local_b80._M_dataplus._M_p,
                                    local_b80.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"ScalingConfigurationId");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"ScalingConfigurationId");
                  Json::Value::asString_abi_cxx11_(&local_b80,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_ae0,(string *)&local_b80);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
                    operator_delete(local_b80._M_dataplus._M_p,
                                    local_b80.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"ScalingGroupId");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"ScalingGroupId");
                  Json::Value::asString_abi_cxx11_(&local_b80,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_ac0,(string *)&local_b80);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
                    operator_delete(local_b80._M_dataplus._M_p,
                                    local_b80.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"HealthStatus");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"HealthStatus");
                  Json::Value::asString_abi_cxx11_(&local_b80,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_aa0,(string *)&local_b80);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
                    operator_delete(local_b80._M_dataplus._M_p,
                                    local_b80.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"LifecycleState");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"LifecycleState");
                  Json::Value::asString_abi_cxx11_(&local_b80,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_a80,(string *)&local_b80);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
                    operator_delete(local_b80._M_dataplus._M_p,
                                    local_b80.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"CreationTime");
                if (bVar3) {
                  pVVar12 = Json::Value::operator[](pVVar11,"CreationTime");
                  Json::Value::asString_abi_cxx11_(&local_b80,pVVar12);
                  std::__cxx11::string::operator=((string *)&local_a60,(string *)&local_b80);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
                    operator_delete(local_b80._M_dataplus._M_p,
                                    local_b80.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar11,"CreationType");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar11,"CreationType");
                  Json::Value::asString_abi_cxx11_(&local_b80,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_a40,(string *)&local_b80);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
                    operator_delete(local_b80._M_dataplus._M_p,
                                    local_b80.field_2._M_allocated_capacity + 1);
                  }
                }
                std::
                vector<aliyun::EssDescribeScalingInstancesScalingInstanceType,_std::allocator<aliyun::EssDescribeScalingInstancesScalingInstanceType>_>
                ::push_back(&local_b48->scaling_instances,(value_type *)local_b00);
                EssDescribeScalingInstancesScalingInstanceType::
                ~EssDescribeScalingInstancesScalingInstanceType
                          ((EssDescribeScalingInstancesScalingInstanceType *)local_b00);
                AVar6 = Json::Value::size(pVVar10);
                index = index + 1;
              } while (index < AVar6);
            }
          }
        }
      }
      goto LAB_00140954;
    }
    if (error_info == (EssErrorInfo *)0x0) goto LAB_0014094f;
    pcVar7 = "parse response failed";
  }
  else {
    if (error_info == (EssErrorInfo *)0x0) {
LAB_0014094f:
      iVar4 = -1;
      goto LAB_00140954;
    }
    pcVar7 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar7);
LAB_00140954:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_b60);
  if (local_b40 != local_b30) {
    operator_delete(local_b40,local_b30[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b20._M_dataplus._M_p != &local_b20.field_2) {
    operator_delete(local_b20._M_dataplus._M_p,
                    CONCAT71(local_b20.field_2._M_allocated_capacity._1_7_,
                             local_b20.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Ess::DescribeScalingInstances(const EssDescribeScalingInstancesRequestType& req,
                      EssDescribeScalingInstancesResponseType* response,
                       EssErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeScalingInstances");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.scaling_group_id.empty()) {
    req_rpc->AddRequestQuery("ScalingGroupId", req.scaling_group_id);
  }
  if(!req.scaling_configuration_id.empty()) {
    req_rpc->AddRequestQuery("ScalingConfigurationId", req.scaling_configuration_id);
  }
  if(!req.health_status.empty()) {
    req_rpc->AddRequestQuery("HealthStatus", req.health_status);
  }
  if(!req.lifecycle_state.empty()) {
    req_rpc->AddRequestQuery("LifecycleState", req.lifecycle_state);
  }
  if(!req.creation_type.empty()) {
    req_rpc->AddRequestQuery("CreationType", req.creation_type);
  }
  if(!req.page_number.empty()) {
    req_rpc->AddRequestQuery("PageNumber", req.page_number);
  }
  if(!req.page_size.empty()) {
    req_rpc->AddRequestQuery("PageSize", req.page_size);
  }
  if(!req.instance_id1.empty()) {
    req_rpc->AddRequestQuery("InstanceId.1", req.instance_id1);
  }
  if(!req.instance_id2.empty()) {
    req_rpc->AddRequestQuery("InstanceId.2", req.instance_id2);
  }
  if(!req.instance_id3.empty()) {
    req_rpc->AddRequestQuery("InstanceId.3", req.instance_id3);
  }
  if(!req.instance_id4.empty()) {
    req_rpc->AddRequestQuery("InstanceId.4", req.instance_id4);
  }
  if(!req.instance_id5.empty()) {
    req_rpc->AddRequestQuery("InstanceId.5", req.instance_id5);
  }
  if(!req.instance_id6.empty()) {
    req_rpc->AddRequestQuery("InstanceId.6", req.instance_id6);
  }
  if(!req.instance_id7.empty()) {
    req_rpc->AddRequestQuery("InstanceId.7", req.instance_id7);
  }
  if(!req.instance_id8.empty()) {
    req_rpc->AddRequestQuery("InstanceId.8", req.instance_id8);
  }
  if(!req.instance_id9.empty()) {
    req_rpc->AddRequestQuery("InstanceId.9", req.instance_id9);
  }
  if(!req.instance_id10.empty()) {
    req_rpc->AddRequestQuery("InstanceId.10", req.instance_id10);
  }
  if(!req.instance_id11.empty()) {
    req_rpc->AddRequestQuery("InstanceId.11", req.instance_id11);
  }
  if(!req.instance_id12.empty()) {
    req_rpc->AddRequestQuery("InstanceId.12", req.instance_id12);
  }
  if(!req.instance_id13.empty()) {
    req_rpc->AddRequestQuery("InstanceId.13", req.instance_id13);
  }
  if(!req.instance_id14.empty()) {
    req_rpc->AddRequestQuery("InstanceId.14", req.instance_id14);
  }
  if(!req.instance_id15.empty()) {
    req_rpc->AddRequestQuery("InstanceId.15", req.instance_id15);
  }
  if(!req.instance_id16.empty()) {
    req_rpc->AddRequestQuery("InstanceId.16", req.instance_id16);
  }
  if(!req.instance_id17.empty()) {
    req_rpc->AddRequestQuery("InstanceId.17", req.instance_id17);
  }
  if(!req.instance_id18.empty()) {
    req_rpc->AddRequestQuery("InstanceId.18", req.instance_id18);
  }
  if(!req.instance_id19.empty()) {
    req_rpc->AddRequestQuery("InstanceId.19", req.instance_id19);
  }
  if(!req.instance_id20.empty()) {
    req_rpc->AddRequestQuery("InstanceId.20", req.instance_id20);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}